

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O1

void __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::~MeshTraversalSequencer
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this)

{
  pointer pIVar1;
  
  (this->super_PointsSequencer)._vptr_PointsSequencer =
       (_func_int **)&PTR__MeshTraversalSequencer_001df9a8;
  (this->traverser_).
  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001df7a8;
  pIVar1 = (this->traverser_).corner_traversal_stack_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)(this->traverser_).corner_traversal_stack_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar1);
  }
  TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  ::~TraverserBase(&(this->traverser_).
                    super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  );
  operator_delete(this,0xc0);
  return;
}

Assistant:

MeshTraversalSequencer(const Mesh *mesh,
                         const MeshAttributeIndicesEncodingData *encoding_data)
      : mesh_(mesh), encoding_data_(encoding_data), corner_order_(nullptr) {}